

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O0

int __thiscall
irr::scene::CMeshSceneNode::clone
          (CMeshSceneNode *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ISceneNode *this_00;
  vector3df *unaff_retaddr;
  vector3df *in_stack_00000008;
  CMeshSceneNode *nb;
  IReferenceCounted *this_01;
  array<irr::video::SMaterial> *other;
  array<irr::video::SMaterial> *in_stack_ffffffffffffffc8;
  int iVar1;
  ISceneNode *in_stack_ffffffffffffffe0;
  
  if (__fn == (__fn *)0x0) {
    __fn = *(__fn **)&this->field_0xc0;
  }
  if (__child_stack == (void *)0x0) {
    __child_stack = *(void **)&this->field_0xc8;
  }
  this_00 = (ISceneNode *)operator_new(0x1f8);
  this_01 = (IReferenceCounted *)&this->field_0x7c;
  other = (array<irr::video::SMaterial> *)&this->field_0x88;
  CMeshSceneNode((CMeshSceneNode *)__fn,(IMesh *)__child_stack,in_stack_ffffffffffffffe0,
                 (ISceneManager *)this,(s32)((ulong)this_00 >> 0x20),
                 (vector3df *)in_stack_ffffffffffffffc8,unaff_retaddr,in_stack_00000008);
  ISceneNode::cloneMembers(this_00,(ISceneNode *)this,(ISceneManager *)this_00);
  this_00[1].field_0xe4 = this->ReadOnlyMaterials & 1;
  core::array<irr::video::SMaterial>::operator=(in_stack_ffffffffffffffc8,other);
  iVar1 = (int)this_00;
  if ((CMeshSceneNode *)__fn != (CMeshSceneNode *)0x0) {
    IReferenceCounted::drop(this_01);
  }
  return iVar1;
}

Assistant:

ISceneNode *CMeshSceneNode::clone(ISceneNode *newParent, ISceneManager *newManager)
{
	if (!newParent)
		newParent = Parent;
	if (!newManager)
		newManager = SceneManager;

	CMeshSceneNode *nb = new CMeshSceneNode(Mesh, newParent,
			newManager, ID, RelativeTranslation, RelativeRotation, RelativeScale);

	nb->cloneMembers(this, newManager);
	nb->ReadOnlyMaterials = ReadOnlyMaterials;
	nb->Materials = Materials;

	if (newParent)
		nb->drop();
	return nb;
}